

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O1

BeliefLowerBound * __thiscall despot::BaseTag::CreateBeliefLowerBound(BaseTag *this,string *name)

{
  int iVar1;
  TagBlindBeliefPolicy *this_00;
  ostream *poVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)name);
  if (iVar1 == 0) {
    this_00 = (TagBlindBeliefPolicy *)operator_new(0x10);
    despot::TrivialBeliefLowerBound::TrivialBeliefLowerBound
              ((TrivialBeliefLowerBound *)this_00,(DSPOMDP *)&this->super_BeliefMDP);
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)name);
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)name);
      if (iVar1 != 0) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"Unsupported belief lower bound: ");
        poVar2 = std::operator<<(poVar2,(string *)name);
        std::endl<char,std::char_traits<char>>(poVar2);
        exit(1);
      }
    }
    this_00 = (TagBlindBeliefPolicy *)operator_new(0x30);
    TagBlindBeliefPolicy::TagBlindBeliefPolicy(this_00,this);
  }
  return &this_00->super_BeliefLowerBound;
}

Assistant:

BeliefLowerBound* BaseTag::CreateBeliefLowerBound(string name) const {
	if (name == "TRIVIAL") {
		return new TrivialBeliefLowerBound(this);
	} else if (name == "DEFAULT" || name == "BLIND") {
		return new TagBlindBeliefPolicy(this);
	} else {
		cerr << "Unsupported belief lower bound: " << name << endl;
		exit(1);
		return NULL;
	}
}